

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrtInfo.cpp
# Opt level: O2

void __thiscall pbrt::semantic::PBRTInfo::PBRTInfo(PBRTInfo *this,SP *scene)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  int *piVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  matsUsedByType;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  it;
  shared_ptr<pbrt::Material> mat;
  undefined1 local_c0 [32];
  _Rb_tree_node_base *local_a0;
  size_t local_98;
  allocator local_89;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_88;
  PBRTInfo *local_60;
  SP *local_58;
  __shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header;
  (this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(this,0,0x110);
  (this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->usedMaterials)._M_t._M_impl.super__Rb_tree_header;
  (this->usedMaterials)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->usedMaterials)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->usedMaterials)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->usedMaterials)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->usedMaterials)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(((scene->super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->world)
              .super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>);
  traverse(this,(SP *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__cxx11::string::string((string *)local_c0,"objects",(allocator *)&local_88);
  Counter::print(&this->numObjects,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string((string *)local_c0,"areaLights",(allocator *)&local_88);
  Counter::print(&this->numAreaLights,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string((string *)local_c0,"shapes",(allocator *)&local_88);
  Counter::print(&this->numShapes,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string((string *)local_c0,"triangles",(allocator *)&local_88);
  Counter::print(&this->numTriangles,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string((string *)local_c0,"quads",(allocator *)&local_88);
  Counter::print(&this->numQuads,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string((string *)local_c0,"disks",(allocator *)&local_88);
  Counter::print(&this->numDisks,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string((string *)local_c0,"spheres",(allocator *)&local_88);
  Counter::print(&this->numSpheres,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string((string *)local_c0,"curves",(allocator *)&local_88);
  Counter::print(&this->numCurves,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string((string *)local_c0,"curve segments",(allocator *)&local_88);
  Counter::print(&this->numCurveSegments,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string((string *)local_c0,"lights",(allocator *)&local_88);
  Counter::print(&this->numLights,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string((string *)local_c0,"point lights",(allocator *)&local_88);
  Counter::print(&this->numPointLights,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string((string *)local_c0,"spot lights",(allocator *)&local_88);
  Counter::print(&this->numSpotLights,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string((string *)local_c0,"distant lights",(allocator *)&local_88);
  Counter::print(&this->numDistantLights,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::string((string *)local_c0,"infinite lights",(allocator *)&local_88);
  Counter::print(&this->numInfiniteLights,(string *)local_c0);
  local_58 = scene;
  std::__cxx11::string::~string((string *)local_c0);
  poVar2 = std::operator<<((ostream *)&std::cout,"total num materials ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  local_c0._24_8_ = local_c0 + 8;
  local_c0._8_4_ = _S_red;
  local_c0._16_8_ = 0;
  local_98 = 0;
  local_a0 = (_Rb_tree_node_base *)local_c0._24_8_;
  local_60 = this;
  for (p_Var4 = (this->usedMaterials)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    std::__shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,(__shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2> *)(p_Var4 + 1));
    if (local_50._M_ptr == (element_type *)0x0) {
      std::__cxx11::string::string((string *)&local_88,"null",&local_89);
      piVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_c0,&local_88.first);
    }
    else {
      (**((local_50._M_ptr)->super_Entity)._vptr_Entity)(&local_88);
      piVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_c0,&local_88.first);
    }
    *piVar3 = *piVar3 + 1;
    std::__cxx11::string::~string((string *)&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"material usage by type:");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (p_Var5 = (_Rb_tree_node_base *)local_c0._24_8_;
      p_Var5 != (_Rb_tree_node_base *)(local_c0 + 8);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::pair(&local_88,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            *)(p_Var5 + 1));
    poVar2 = std::operator<<((ostream *)&std::cout," - ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_88.second);
    poVar2 = std::operator<<(poVar2,"x\t");
    poVar2 = std::operator<<(poVar2,(string *)&local_88);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_88);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"scene bounds ");
  (*(((((local_58->super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->world).
      super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Entity).
    _vptr_Entity[3])(&local_88);
  poVar2 = math::operator<<(poVar2,(box3f *)&local_88);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_c0);
  return;
}

Assistant:

PBRTInfo(Scene::SP scene)
      {
        traverse(scene->world);
        numObjects.print("objects");
        numAreaLights.print("areaLights");
        numShapes.print("shapes");
        numTriangles.print("triangles");
        numQuads.print("quads");
        numDisks.print("disks");
        numSpheres.print("spheres");
        numCurves.print("curves");
        numCurveSegments.print("curve segments");
        numLights.print("lights");
        numPointLights.print("point lights");
        numSpotLights.print("spot lights");
        numDistantLights.print("distant lights");
        numInfiniteLights.print("infinite lights");
        std::cout << "total num materials " << usedMaterials.size() << std::endl;
        std::map<std::string,int> matsUsedByType;
        for (auto mat : usedMaterials)
          if (mat)
            matsUsedByType[mat->toString()]++;
          else
            matsUsedByType["null"]++;
            
        std::cout << "material usage by type:" << std::endl;
        for (auto it : matsUsedByType)
          std::cout << " - " << it.second << "x\t" << it.first << std::endl;
        std::cout << "scene bounds " << scene->getBounds() << std::endl;
      }